

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var __thiscall
Js::JavascriptNativeArray::FindMinOrMax<double,true>
          (JavascriptNativeArray *this,ScriptContext *scriptContext,bool findMax)

{
  double value;
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  SparseArraySegmentBase *pSVar7;
  SparseArraySegmentBase **ppSVar8;
  JavascriptLibrary *this_00;
  Var pvVar9;
  double compare;
  double dStack_40;
  uint i;
  double currentRes;
  uint headSegLen;
  SparseArraySegment<double> *headSegment;
  uint len;
  bool findMax_local;
  ScriptContext *scriptContext_local;
  JavascriptNativeArray *this_local;
  
  bVar3 = Js::JavascriptArray::HasNoMissingValues(&this->super_JavascriptArray);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa10,"(this->HasNoMissingValues())",
                                "Fastpath is only for arrays with one segment and no missing values"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar4 = ArrayObject::GetLength((ArrayObject *)this);
  pSVar7 = Js::JavascriptArray::GetHead(&this->super_JavascriptArray);
  uVar1 = pSVar7->length;
  if (uVar1 != uVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa15,"(headSegLen == len)","headSegLen == len");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ppSVar8 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pSVar7->next);
  if (*ppSVar8 != (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa2b,"(false)",
                                "FindMinOrMax currently supports native arrays with only one segment"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
    Throw::FatalInternalError(-0x7fffbffb);
  }
  dStack_40 = *(double *)(pSVar7 + 1);
  compare._4_4_ = 0;
  do {
    if (uVar1 <= compare._4_4_) {
      pvVar9 = JavascriptNumber::ToVarNoCheck(dStack_40,scriptContext);
      return pvVar9;
    }
    value = *(double *)(&pSVar7[1].left + (ulong)compare._4_4_ * 2);
    BVar5 = JavascriptNumber::IsNan(value);
    if (BVar5 != 0) {
      this_00 = ScriptContext::GetLibrary(scriptContext);
      pvVar9 = JavascriptLibraryBase::GetNaN(&this_00->super_JavascriptLibraryBase);
      return pvVar9;
    }
    if (findMax) {
      if (dStack_40 < value) {
LAB_010ea7b7:
        dStack_40 = value;
      }
    }
    else if ((value < dStack_40) ||
            (((value == 0.0 && (!NAN(value))) &&
             (BVar5 = JavascriptNumber::IsNegZero(dStack_40), BVar5 != 0)))) goto LAB_010ea7b7;
    compare._4_4_ = compare._4_4_ + 1;
  } while( true );
}

Assistant:

Var JavascriptNativeArray::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        AssertMsg(this->HasNoMissingValues(), "Fastpath is only for arrays with one segment and no missing values");
        uint len = this->GetLength();

        Js::SparseArraySegment<T>* headSegment = ((Js::SparseArraySegment<T>*)this->GetHead());
        uint headSegLen = headSegment->length;
        Assert(headSegLen == len);

        if (headSegment->next == nullptr)
        {
            T currentRes = headSegment->elements[0];
            for (uint i = 0; i < headSegLen; i++)
            {
                T compare = headSegment->elements[i];
                if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
                {
                    return scriptContext->GetLibrary()->GetNaN();
                }
                if (findMax ? currentRes < compare : currentRes > compare ||
                    (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
                {
                    currentRes = compare;
                }
            }
            return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
        }
        else
        {
            AssertMsg(false, "FindMinOrMax currently supports native arrays with only one segment");
            Throw::FatalInternalError();
        }
    }